

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_3dfloors.cpp
# Opt level: O2

void swrenderer::R_3D_AddHeight(secplane_t *add,sector_t *sec)

{
  double *pdVar1;
  undefined8 *puVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  DVector2 local_18;
  
  local_18.X = ViewPos.X;
  local_18.Y = ViewPos.Y;
  dVar4 = secplane_t::ZatPoint(add,&local_18);
  dVar5 = sector_t::CenterCeiling(sec);
  if ((dVar4 < dVar5) && (dVar5 = sector_t::CenterFloor(sec), dVar5 < dVar4)) {
    fakeActive = 1;
    if (height_max < 0) {
      pdVar3 = (double *)
               M_Malloc_Dbg(0x18,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_3dfloors.cpp"
                            ,0x56);
      height_top = pdVar3;
      height_cur = pdVar3;
      *pdVar3 = dVar4;
      pdVar3[1] = 0.0;
      pdVar3[2] = 0.0;
    }
    else {
      for (pdVar3 = (double *)&height_top; pdVar3 = (double *)*pdVar3, pdVar3 != (double *)0x0;
          pdVar3 = pdVar3 + 2) {
        if (dVar4 <= *pdVar3) {
          if (*pdVar3 == dVar4) {
            fakeActive = 1;
            return;
          }
          pdVar1 = (double *)
                   M_Malloc_Dbg(0x18,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_3dfloors.cpp"
                                ,0x46);
          *pdVar1 = dVar4;
          dVar4 = pdVar3[1];
          pdVar1[1] = dVar4;
          pdVar1[2] = (double)pdVar3;
          puVar2 = &height_top;
          if (dVar4 != 0.0) {
            puVar2 = (undefined8 *)((long)dVar4 + 0x10);
          }
          *puVar2 = pdVar1;
          pdVar3[1] = (double)pdVar1;
          goto LAB_002f68b5;
        }
      }
      pdVar3 = (double *)
               M_Malloc_Dbg(0x18,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_3dfloors.cpp"
                            ,0x4e);
      *pdVar3 = dVar4;
      pdVar3[1] = (double)height_cur;
      pdVar3[2] = 0.0;
      height_cur[2] = (double)pdVar3;
      height_cur = pdVar3;
    }
LAB_002f68b5:
    height_max = height_max + 1;
  }
  return;
}

Assistant:

void R_3D_AddHeight(secplane_t *add, sector_t *sec)
{
	HeightLevel *near;
	HeightLevel *curr;

	double height = add->ZatPoint(ViewPos);
	if(height >= sec->CenterCeiling()) return;
	if(height <= sec->CenterFloor()) return;

	fakeActive = 1;

	if(height_max >= 0) {
		near = height_top;
		while(near && near->height < height) near = near->next;
		if(near) {
			if(near->height == height) return;
			curr = (HeightLevel*)M_Malloc(sizeof(HeightLevel));
			curr->height = height;
			curr->prev = near->prev;
			curr->next = near;
			if(near->prev) near->prev->next = curr;
			else height_top = curr;
			near->prev = curr;
		} else {
			curr = (HeightLevel*)M_Malloc(sizeof(HeightLevel));
			curr->height = height;
			curr->prev = height_cur;
			curr->next = NULL;
			height_cur->next = curr;
			height_cur = curr;
		}
	} else {
		height_top = height_cur = (HeightLevel*)M_Malloc(sizeof(HeightLevel));
		height_top->height = height;
		height_top->prev = NULL;
		height_top->next = NULL;
	}
	height_max++;
}